

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall QProcess::~QProcess(QProcess *this)

{
  QProcessPrivate *this_00;
  QObjectData *pQVar1;
  undefined8 uVar2;
  storage_type *in_RCX;
  QObject *pQVar3;
  EVP_PKEY_CTX *in_RSI;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QString local_90;
  QArrayData *local_78;
  QChar *local_70;
  size_t local_68;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  char *local_48;
  undefined1 local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QIODevice).super_QObject._vptr_QObject = (_func_int **)&PTR_metaObject_0069fcb8;
  this_00 = (QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  if (this_00->processState != '\0') {
    local_60 = 2;
    local_5c = 0;
    uStack_54 = 0;
    local_4c = 0;
    local_48 = "default";
    QMessageLogger::warning((QMessageLogger *)local_40);
    uVar2 = local_40._0_8_;
    *(bool *)(local_40._0_8_ + 0x30) = false;
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"QProcess: Destroyed while process (";
    QString::fromUtf8((QString *)(local_40 + 8),(QString *)0x23,ba);
    ::QTextStream::operator<<((QTextStream *)uVar2,(QString *)(local_40 + 8));
    if ((QArrayData *)local_40._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_40._8_8_,2,0x10);
      }
    }
    if (*(bool *)(local_40._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_40._0_8_,' ');
    }
    pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
    local_90.d.d = (Data *)pQVar1[7]._vptr_QObjectData;
    local_90.d.ptr = (char16_t *)pQVar1[7].q_ptr;
    pQVar3 = pQVar1[7].parent;
    if ((QArrayData *)local_90.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_90.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_90.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.d.size = (qsizetype)pQVar3;
    QDir::toNativeSeparators(&local_90);
    if (local_70 == (QChar *)0x0) {
      local_70 = (QChar *)&QString::_empty;
    }
    QDebug::putString((QDebug *)local_40,local_70,local_68);
    if (*(bool *)(local_40._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_40._0_8_,' ');
    }
    uVar2 = local_40._0_8_;
    ba_00.m_data = (storage_type *)pQVar3;
    ba_00.m_size = (qsizetype)") is still running.";
    QString::fromUtf8((QString *)(local_40 + 8),(QString *)0x13,ba_00);
    ::QTextStream::operator<<((QTextStream *)uVar2,(QString *)(local_40 + 8));
    if ((QArrayData *)local_40._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_40._8_8_,2,0x10);
      }
    }
    if (*(bool *)(local_40._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_40._0_8_,' ');
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
      }
    }
    QDebug::~QDebug((QDebug *)local_40);
    QProcessPrivate::killProcess((QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d);
    in_RSI = (EVP_PKEY_CTX *)0x7530;
    waitForFinished(this,30000);
  }
  QProcessPrivate::cleanup(this_00,in_RSI);
  QIODevice::~QIODevice(&this->super_QIODevice);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QProcess::~QProcess()
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning().nospace()
            << "QProcess: Destroyed while process (" << QDir::toNativeSeparators(program()) << ") is still running.";
        kill();
        waitForFinished();
    }
    d->cleanup();
}